

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

Split * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::find
          (Split *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  unsigned_long uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  byte bVar9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  SpatialSplit spatial_split;
  ObjectSplit object_split;
  SplitInfo oinfo;
  SpatialSplit local_108;
  ObjectSplit local_b8;
  SplitInfo local_78;
  
  if ((set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end -
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin < 0xc00) {
    sequential_object_find(&local_b8,this,set,logBlockSize,&local_78);
  }
  else {
    parallel_object_find(&local_b8,this,set,logBlockSize,&local_78);
  }
  fVar8 = local_b8.sah;
  uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  if ((set->super_extended_range<unsigned_long>)._ext_end != uVar3) {
    auVar5 = vmaxps_avx((undefined1  [16])local_78.leftBounds.lower.field_0,
                        (undefined1  [16])local_78.rightBounds.lower.field_0);
    auVar6 = vminps_avx((undefined1  [16])local_78.leftBounds.upper.field_0,
                        (undefined1  [16])local_78.rightBounds.upper.field_0);
    auVar4 = vcmpps_avx(auVar5,auVar6,2);
    uVar10 = vmovmskps_avx(auVar4);
    bVar9 = (byte)uVar10 & 7;
    fVar12 = 0.0;
    auVar4 = vsubps_avx(auVar6,auVar5);
    fVar11 = 0.0;
    if (bVar9 == 7) {
      auVar5 = vmovshdup_avx(auVar4);
      auVar6 = vshufpd_avx(auVar4,auVar4,1);
      fVar11 = auVar4._0_4_ * (auVar5._0_4_ + auVar6._0_4_) + auVar5._0_4_ * auVar6._0_4_;
      fVar11 = fVar11 + fVar11;
    }
    aVar1 = (this->root_info->geomBounds).lower.field_0;
    aVar2 = (this->root_info->geomBounds).upper.field_0;
    auVar5 = vcmpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar2,2);
    uVar10 = vmovmskps_avx(auVar5);
    if ((~(byte)uVar10 & 7) == 0) {
      auVar7 = vsubps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar1);
      auVar5 = vmovshdup_avx(auVar7);
      auVar6 = vshufpd_avx(auVar7,auVar7,1);
      fVar12 = auVar7._0_4_ * (auVar5._0_4_ + auVar6._0_4_) + auVar5._0_4_ * auVar6._0_4_;
      fVar12 = (fVar12 + fVar12) * 5e-06;
    }
    if (fVar12 <= fVar11) {
      fVar12 = 0.0;
      fVar11 = 0.0;
      if (bVar9 == 7) {
        auVar5 = vmovshdup_avx(auVar4);
        auVar6 = vshufpd_avx(auVar4,auVar4,1);
        fVar11 = auVar4._0_4_ * (auVar5._0_4_ + auVar6._0_4_) + auVar5._0_4_ * auVar6._0_4_;
        fVar11 = fVar11 + fVar11;
      }
      aVar1 = (set->super_CentGeomBBox3fa).geomBounds.lower.field_0;
      aVar2 = (set->super_CentGeomBBox3fa).geomBounds.upper.field_0;
      auVar4 = vcmpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar2,2);
      uVar10 = vmovmskps_avx(auVar4);
      if ((~(byte)uVar10 & 7) == 0) {
        auVar6 = vsubps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar1);
        auVar4 = vmovshdup_avx(auVar6);
        auVar5 = vshufpd_avx(auVar6,auVar6,1);
        fVar12 = auVar6._0_4_ * (auVar4._0_4_ + auVar5._0_4_) + auVar4._0_4_ * auVar5._0_4_;
        fVar12 = (fVar12 + fVar12) * 0.1;
      }
      if (fVar12 <= fVar11) {
        if (uVar3 - (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin <
            0xc00) {
          sequential_spatial_find(&local_108,this,set,logBlockSize);
        }
        else {
          parallel_spatial_find(&local_108,this,set,logBlockSize);
        }
        if ((local_108.sah < fVar8 * 0.99) &&
           (uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end,
           ((set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin - uVar3) +
           (long)local_108.right + (long)local_108.left <=
           (set->super_extended_range<unsigned_long>)._ext_end - uVar3)) {
          __return_storage_ptr__->spatial = true;
          __return_storage_ptr__->sah = local_108.sah;
          *(ulong *)__return_storage_ptr__->data = CONCAT44(local_108.dim,local_108.sah);
          *(ulong *)(__return_storage_ptr__->data + 8) = CONCAT44(local_108.left,local_108.pos);
          *(ulong *)(__return_storage_ptr__->data + 0x10) =
               CONCAT44(local_108.factor,local_108.right);
          *(undefined8 *)(__return_storage_ptr__->data + 0x20) = local_108.mapping.ofs.field_0._0_8_
          ;
          *(undefined8 *)(__return_storage_ptr__->data + 0x28) = local_108.mapping.ofs.field_0._8_8_
          ;
          *(undefined8 *)(__return_storage_ptr__->data + 0x30) =
               local_108.mapping.scale.field_0._0_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x38) =
               local_108.mapping.scale.field_0._8_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x40) =
               local_108.mapping.inv_scale.field_0._0_8_;
          *(undefined8 *)(__return_storage_ptr__->data + 0x48) =
               local_108.mapping.inv_scale.field_0._8_8_;
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->spatial = false;
  __return_storage_ptr__->sah = fVar8;
  *(ulong *)__return_storage_ptr__->data = CONCAT44(local_b8.dim,local_b8.sah);
  *(undefined8 *)(__return_storage_ptr__->data + 8) = local_b8._8_8_;
  *(size_t *)(__return_storage_ptr__->data + 0x10) = local_b8.mapping.num;
  *(undefined8 *)(__return_storage_ptr__->data + 0x20) = local_b8.mapping.ofs.field_0._0_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x28) = local_b8.mapping.ofs.field_0._8_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x30) = local_b8.mapping.scale.field_0._0_8_;
  *(undefined8 *)(__return_storage_ptr__->data + 0x38) = local_b8.mapping.scale.field_0._8_8_;
  return __return_storage_ptr__;
}

Assistant:

const Split find(const PrimInfoExtRange& set, const size_t logBlockSize)
        {
          SplitInfo oinfo;
          const ObjectSplit object_split = object_find(set,logBlockSize,oinfo);
          const float object_split_sah = object_split.splitSAH();

          if (unlikely(set.has_ext_range()))
          {
            const BBox3fa overlap = intersect(oinfo.leftBounds, oinfo.rightBounds);
            
            /* do only spatial splits if the child bounds overlap */
            if (safeArea(overlap) >= SPATIAL_ASPLIT_AREA_THRESHOLD*safeArea(root_info.geomBounds) &&
                safeArea(overlap) >= SPATIAL_ASPLIT_OVERLAP_THRESHOLD*safeArea(set.geomBounds))
            {              
              const SpatialSplit spatial_split = spatial_find(set, logBlockSize);
              const float spatial_split_sah = spatial_split.splitSAH();

              /* valid spatial split, better SAH and number of splits do not exceed extended range */
              if (spatial_split_sah < SPATIAL_ASPLIT_SAH_THRESHOLD*object_split_sah &&
                  spatial_split.left + spatial_split.right - set.size() <= set.ext_range_size())
              {          
                return Split(spatial_split,spatial_split_sah);
              }
            }
          }

          return Split(object_split,object_split_sah);
        }